

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  uint uVar1;
  sqlite3_stmt *pStmt;
  Fts5Config *pFVar2;
  int iVar3;
  char *pcVar4;
  void *p_00;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  sqlite3_stmt **ppStmt_00;
  
  uVar8 = (ulong)(uint)eStmt;
  ppStmt_00 = p->aStmt + uVar8;
  iVar3 = 0;
  if (*ppStmt_00 != (sqlite3_stmt *)0x0) goto LAB_001c7e81;
  pFVar2 = p->pConfig;
  switch(uVar8) {
  case 0:
  case 1:
    pcVar4 = pFVar2->zContentRowid;
    pcVar4 = sqlite3_mprintf((&PTR_anon_var_dwarf_e4dc7_00211a80)[uVar8],pFVar2->zContentExprlist,
                             pFVar2->zContent,pcVar4,pcVar4,pcVar4);
    break;
  case 2:
    pcVar4 = sqlite3_mprintf((&PTR_anon_var_dwarf_e4dc7_00211a80)[uVar8],pFVar2->zContentExprlist,
                             pFVar2->zContent,pFVar2->zContentRowid);
    break;
  case 3:
  case 4:
    uVar1 = pFVar2->nCol;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      p_00 = sqlite3Malloc((long)(int)(uVar1 * 2 + 3));
    }
    else {
      p_00 = (void *)0x0;
    }
    if (p_00 == (void *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      if ((int)uVar1 < 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          *(undefined2 *)((long)p_00 + uVar5) = 0x2c3f;
          uVar5 = uVar5 + 2;
        } while ((ulong)uVar1 * 2 + 2 != uVar5);
        uVar5 = uVar5 & 0xffffffff;
      }
      *(undefined1 *)((long)p_00 + (uVar5 - 1)) = 0;
      pcVar4 = sqlite3_mprintf((&PTR_anon_var_dwarf_e4dc7_00211a80)[uVar8],pFVar2->zDb,pFVar2->zName
                               ,p_00);
      sqlite3_free(p_00);
    }
    break;
  default:
    pcVar4 = (&PTR_anon_var_dwarf_e4dc7_00211a80)[uVar8];
    pcVar7 = pFVar2->zDb;
    pcVar6 = pFVar2->zName;
    goto LAB_001c7f29;
  case 10:
    pcVar4 = (&PTR_anon_var_dwarf_e4dc7_00211a80)[uVar8];
    pcVar6 = pFVar2->zContent;
    pcVar7 = pFVar2->zContentExprlist;
LAB_001c7f29:
    pcVar4 = sqlite3_mprintf(pcVar4,pcVar7,pcVar6);
  }
  if (pcVar4 == (char *)0x0) {
    iVar3 = 7;
  }
  else {
    iVar3 = sqlite3LockAndPrepare
                      (pFVar2->db,pcVar4,-1,(uint)(2 < eStmt) * 4 + 0x81,(Vdbe *)0x0,ppStmt_00,
                       (char **)0x0);
    sqlite3_free(pcVar4);
    if ((pzErrMsg != (char **)0x0) && (iVar3 != 0)) {
      pcVar4 = sqlite3_errmsg(pFVar2->db);
      pcVar4 = sqlite3_mprintf("%s",pcVar4);
      *pzErrMsg = pcVar4;
    }
  }
LAB_001c7e81:
  pStmt = *ppStmt_00;
  *ppStmt = pStmt;
  sqlite3_reset(pStmt);
  return iVar3;
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for 
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE 
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE 
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE 
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?)",       /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz FROM %Q.'%q_docsize' WHERE id=?",      /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt], 
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist, 
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
        zSql = sqlite3_mprintf(azStmt[eStmt], 
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT: 
      case FTS5_STMT_REPLACE_CONTENT: {
        int nCol = pC->nCol + 1;
        char *zBind;
        int i;

        zBind = sqlite3_malloc64(1 + nCol*2);
        if( zBind ){
          for(i=0; i<nCol; i++){
            zBind[i*2] = '?';
            zBind[i*2 + 1] = ',';
          }
          zBind[i*2-1] = '\0';
          zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName, zBind);
          sqlite3_free(zBind);
        }
        break;
      }

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP ) f |= SQLITE_PREPARE_NO_VTAB;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}